

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

void __thiscall
ctemplate::TemplateDictionary::SetEscapedFormattedValue
          (TemplateDictionary *this,TemplateString variable,TemplateModifier *escfn,char *format,...
          )

{
  TemplateString value;
  char in_AL;
  int iVar1;
  char *space;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string escaped_string;
  char *buffer;
  va_list ap;
  allocator local_171;
  pointer local_170;
  size_type sStack_168;
  undefined1 local_160;
  uint7 uStack_15f;
  undefined8 uStack_158;
  string local_150;
  string local_130;
  char *local_110;
  __va_list_tag local_108;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Da;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  space = UnsafeArena::Alloc(this->arena_,0x400);
  local_108.overflow_arg_area = &stack0x00000028;
  local_108.gp_offset = 0x18;
  local_108.fp_offset = 0x30;
  local_108.reg_save_area = local_e8;
  iVar1 = StringAppendV(space,&local_110,format,&local_108);
  std::__cxx11::string::string((string *)&local_150,"",&local_171);
  TemplateModifier::operator()(&local_130,escfn,local_110,(long)iVar1,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  BaseArena::AdjustLastAlloc(&this->arena_->super_BaseArena,space,0);
  if (local_110 != (char *)0x0 && local_110 != space) {
    operator_delete__(local_110);
  }
  local_170 = local_130._M_dataplus._M_p;
  sStack_168 = local_130._M_string_length;
  local_160 = 0;
  uStack_158 = 0;
  value.length_ = local_130._M_string_length;
  value.ptr_ = local_130._M_dataplus._M_p;
  value._16_8_ = (ulong)uStack_15f << 8;
  value.id_ = 0;
  SetValue(this,variable,value);
  std::__cxx11::string::~string((string *)&local_130);
  return;
}

Assistant:

void TemplateDictionary::SetEscapedFormattedValue(TemplateString variable,
                                                  const TemplateModifier& escfn,
                                                  const char* format, ...) {
  char* buffer;

  char* scratch = arena_->Alloc(1024);  // StringAppendV requires >=1024 bytes
  va_list ap;
  va_start(ap, format);
  const int buflen = StringAppendV(scratch, &buffer, format, ap);
  va_end(ap);

  string escaped_string(escfn(buffer, buflen));
  // Reclaim the arena space: the value we care about is now in escaped_string
  arena_->Shrink(scratch, 0);   // reclaim arena space we didn't use
  if (buffer != scratch)
    delete[] buffer;

  SetValue(variable, escaped_string);
}